

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stmt.cpp
# Opt level: O2

string * __thiscall
sqlite::Connection::Stmt::bind_parameter_name_abi_cxx11_
          (string *__return_storage_ptr__,Stmt *this,int index)

{
  char *pcVar1;
  Logic_error *this_00;
  allocator local_b9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  string local_98;
  string local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  pcVar1 = (char *)sqlite3_bind_parameter_name(this->stmt_,index);
  if (pcVar1 != (char *)0x0) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar1,(allocator *)&local_b8);
    return __return_storage_ptr__;
  }
  this_00 = (Logic_error *)__cxa_allocate_exception(0x48);
  std::__cxx11::to_string(&local_78,index);
  std::operator+(&local_58,"Error looking up bind var name for index ",&local_78);
  std::operator+(&local_38,&local_58,": ");
  pcVar1 = (char *)sqlite3_errmsg(this->db_);
  std::operator+(&local_b8,&local_38,pcVar1);
  pcVar1 = (char *)sqlite3_sql(this->stmt_);
  std::__cxx11::string::string((string *)&local_98,pcVar1,&local_b9);
  Logic_error::Logic_error(this_00,&local_b8,&local_98,1,this->db_);
  __cxa_throw(this_00,&Logic_error::typeinfo,Logic_error::~Logic_error);
}

Assistant:

std::string Connection::Stmt::bind_parameter_name(const int index)
    {
        const char * name = sqlite3_bind_parameter_name(stmt_, index);
        if(!name)
        {
            throw Logic_error("Error looking up bind var name for index " +
                std::to_string(index) + ": " + sqlite3_errmsg(db_), sqlite3_sql(stmt_), SQLITE_ERROR, db_);
        }
        return std::string(name);
    }